

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void google::protobuf::internal::PackedFieldHelper<15>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  uint8 *puVar1;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  
  if (*field != 0) {
    uVar6 = md->tag;
    pbVar3 = output->ptr;
    if (uVar6 < 0x80) {
      *pbVar3 = (byte)uVar6;
      pbVar3 = pbVar3 + 1;
    }
    else {
      *pbVar3 = (byte)uVar6 | 0x80;
      if (uVar6 < 0x4000) {
        pbVar3[1] = (byte)(uVar6 >> 7);
        pbVar3 = pbVar3 + 2;
      }
      else {
        pbVar3 = pbVar3 + 2;
        uVar6 = uVar6 >> 7;
        do {
          pbVar4 = pbVar3;
          pbVar4[-1] = (byte)uVar6 | 0x80;
          uVar7 = uVar6 >> 7;
          pbVar3 = pbVar4 + 1;
          bVar2 = 0x3fff < uVar6;
          uVar6 = uVar7;
        } while (bVar2);
        *pbVar4 = (byte)uVar7;
      }
    }
    output->ptr = pbVar3;
    uVar6 = *(uint *)((long)field + 0x10);
    if (uVar6 < 0x80) {
      *pbVar3 = (byte)uVar6;
      pbVar3 = pbVar3 + 1;
    }
    else {
      *pbVar3 = (byte)uVar6 | 0x80;
      if (uVar6 < 0x4000) {
        pbVar3[1] = (byte)(uVar6 >> 7);
        pbVar3 = pbVar3 + 2;
      }
      else {
        pbVar3 = pbVar3 + 2;
        uVar6 = uVar6 >> 7;
        do {
          pbVar4 = pbVar3;
          pbVar4[-1] = (byte)uVar6 | 0x80;
          uVar7 = uVar6 >> 7;
          pbVar3 = pbVar4 + 1;
          bVar2 = 0x3fff < uVar6;
          uVar6 = uVar7;
        } while (bVar2);
        *pbVar4 = (byte)uVar7;
      }
    }
    output->ptr = pbVar3;
    if (0 < *field) {
      lVar5 = 0;
      do {
        puVar1 = output->ptr;
        *(undefined4 *)puVar1 = *(undefined4 *)(*(long *)((long)field + 8) + lVar5 * 4);
        output->ptr = puVar1 + 4;
        lVar5 = lVar5 + 1;
      } while (lVar5 < *field);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}